

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O0

int repeat_segment_data_resize_buffer(repeat_segment_data *data,uint32_t new_size)

{
  float *pfVar1;
  float *new_buffer;
  uint32_t new_size_local;
  repeat_segment_data *data_local;
  
  pfVar1 = (float *)crealloc(data->buffer,(ulong)data->buffer_size,(ulong)new_size,4);
  if (pfVar1 != (float *)0x0) {
    data->buffer = pfVar1;
    data->buffer_size = new_size;
    data->buffer_index = 0;
  }
  else {
    mixed_err(1);
  }
  data_local._4_4_ = (uint)(pfVar1 != (float *)0x0);
  return data_local._4_4_;
}

Assistant:

int repeat_segment_data_resize_buffer(struct repeat_segment_data *data, uint32_t new_size) {
  float *new_buffer = crealloc(data->buffer, data->buffer_size, new_size, sizeof(float));
  if (!new_buffer){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }
  data->buffer = new_buffer;
  data->buffer_size = new_size;
  data->buffer_index = 0;
  return 1;
}